

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_GetBakedQuad(stbtt_bakedchar *chardata,int pw,int ph,int char_index,float *xpos,
                       float *ypos,stbtt_aligned_quad *q,int opengl_fillrule)

{
  stbtt_bakedchar *psVar1;
  double dVar2;
  double dVar3;
  float local_54;
  int round_y;
  int round_x;
  stbtt_bakedchar *b;
  float iph;
  float ipw;
  float d3d_bias;
  float *ypos_local;
  float *xpos_local;
  int char_index_local;
  int ph_local;
  int pw_local;
  stbtt_bakedchar *chardata_local;
  
  local_54 = 0.0;
  if (opengl_fillrule == 0) {
    local_54 = -0.5;
  }
  psVar1 = chardata + char_index;
  dVar2 = std::floor((double)(ulong)(uint)(*xpos + psVar1->xoff + 0.5));
  dVar3 = std::floor((double)(ulong)(uint)(*ypos + psVar1->yoff + 0.5));
  q->x0 = (float)(int)SUB84(dVar2,0) + local_54;
  q->y0 = (float)(int)SUB84(dVar3,0) + local_54;
  q->x1 = (float)(int)(((int)SUB84(dVar2,0) + (uint)psVar1->x1) - (uint)psVar1->x0) + local_54;
  q->y1 = (float)(int)(((int)SUB84(dVar3,0) + (uint)psVar1->y1) - (uint)psVar1->y0) + local_54;
  q->s0 = (float)psVar1->x0 * (1.0 / (float)pw);
  q->t0 = (float)psVar1->y0 * (1.0 / (float)ph);
  q->s1 = (float)psVar1->x1 * (1.0 / (float)pw);
  q->t1 = (float)psVar1->y1 * (1.0 / (float)ph);
  *xpos = psVar1->xadvance + *xpos;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetBakedQuad(stbtt_bakedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int opengl_fillrule)
{
   float d3d_bias = opengl_fillrule ? 0 : -0.5f;
   float ipw = 1.0f / pw, iph = 1.0f / ph;
   stbtt_bakedchar *b = chardata + char_index;
   int round_x = STBTT_ifloor((*xpos + b->xoff) + 0.5f);
   int round_y = STBTT_ifloor((*ypos + b->yoff) + 0.5f);

   q->x0 = round_x + d3d_bias;
   q->y0 = round_y + d3d_bias;
   q->x1 = round_x + b->x1 - b->x0 + d3d_bias;
   q->y1 = round_y + b->y1 - b->y0 + d3d_bias;

   q->s0 = b->x0 * ipw;
   q->t0 = b->y0 * iph;
   q->s1 = b->x1 * ipw;
   q->t1 = b->y1 * iph;

   *xpos += b->xadvance;
}